

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::updatePitch(TVP *this)

{
  bool bVar1;
  Bit32s BVar2;
  ControlROMPCMStruct *pCVar3;
  Synth *pSVar4;
  TVA *this_00;
  uint local_14;
  Bit32s newPitch;
  TVP *this_local;
  
  local_14 = this->basePitch + this->currentPitchOffset;
  bVar1 = Partial::isPCM(this->partial);
  if ((!bVar1) || (pCVar3 = Partial::getControlROMPCMStruct(this->partial), (pCVar3->len & 1) == 0))
  {
    pSVar4 = Partial::getSynth(this->partial);
    BVar2 = Synth::getMasterTunePitchDelta(pSVar4);
    local_14 = BVar2 + local_14;
  }
  if (((this->partialParam->wg).pitchBenderEnabled & 1) != 0) {
    BVar2 = Part::getPitchBend(this->part);
    local_14 = BVar2 + local_14;
  }
  pSVar4 = Partial::getSynth(this->partial);
  if ((*(ushort *)pSVar4->controlROMFeatures >> 1 & 1) == 0) {
    if ((int)local_14 < 0) {
      local_14 = 0;
    }
  }
  else {
    local_14 = local_14 & 0xffff;
  }
  if (0xe800 < (int)local_14) {
    local_14 = 0xe800;
  }
  this->pitch = (Bit16u)local_14;
  this_00 = Partial::getTVA(this->partial);
  TVA::recalcSustain(this_00);
  return;
}

Assistant:

void TVP::updatePitch() {
	Bit32s newPitch = basePitch + currentPitchOffset;
	if (!partial->isPCM() || (partial->getControlROMPCMStruct()->len & 0x01) == 0) { // FIXME: Use !partial->pcmWaveEntry->unaffectedByMasterTune instead
		// FIXME: There are various bugs not yet emulated
		// 171 is ~half a semitone.
		newPitch += partial->getSynth()->getMasterTunePitchDelta();
	}
	if ((partialParam->wg.pitchBenderEnabled & 1) != 0) {
		newPitch += part->getPitchBend();
	}

	// MT-32 GEN0 does 16-bit calculations here, allowing an integer overflow.
	// This quirk is exploited e.g. in Colonel's Bequest timbres "Lightning" and "SwmpBackgr".
	if (partial->getSynth()->controlROMFeatures->quirkPitchEnvelopeOverflow) {
		newPitch = newPitch & 0xffff;
	} else if (newPitch < 0) {
		newPitch = 0;
	}
	// This check is present in every unit.
	if (newPitch > 59392) {
		newPitch = 59392;
	}
	pitch = Bit16u(newPitch);

	// FIXME: We're doing this here because that's what the CM-32L does - we should probably move this somewhere more appropriate in future.
	partial->getTVA()->recalcSustain();
}